

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

bool __thiscall ON_BezierCurve::Transform(ON_BezierCurve *this,ON_Xform *xform)

{
  double dVar1;
  bool bVar2;
  
  if ((this->m_is_rat == 0) &&
     ((((dVar1 = xform->m_xform[3][0], dVar1 != 0.0 || (NAN(dVar1))) ||
       (dVar1 = xform->m_xform[3][1], dVar1 != 0.0)) ||
      (((NAN(dVar1) || (dVar1 = xform->m_xform[3][2], dVar1 != 0.0)) || (NAN(dVar1))))))) {
    MakeRational(this);
  }
  bVar2 = ON_TransformPointList
                    (this->m_dim,this->m_is_rat != 0,this->m_order,this->m_cv_stride,this->m_cv,
                     xform);
  return bVar2;
}

Assistant:

bool ON_BezierCurve::Transform( 
       const ON_Xform& xform
       )
{
  if ( 0 == m_is_rat )
  {
    if ( xform.m_xform[3][0] != 0.0 || xform.m_xform[3][1] != 0.0 || xform.m_xform[3][2] != 0.0 )
    {
      MakeRational();
    }
  }
  return ON_TransformPointList( m_dim, m_is_rat, m_order, m_cv_stride, m_cv, xform );
}